

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O0

string * getAttribute(string *__return_storage_ptr__,string *source,string *attrName)

{
  size_t endpos;
  size_t startpos;
  string attr_namefull;
  string *attrName_local;
  string *source_local;
  
  attr_namefull.field_2._8_8_ = attrName;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&startpos,
                 attrName,"=\"");
  std::__cxx11::string::find((string *)source,(ulong)&startpos);
  std::__cxx11::string::size();
  std::__cxx11::string::find((char *)source,0x486289);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)source);
  std::__cxx11::string::~string((string *)&startpos);
  return __return_storage_ptr__;
}

Assistant:

static std::string getAttribute(const std::string &source, const std::string &attrName) {
	std::string attr_namefull = attrName + "=\"";
	std::size_t startpos = source.find(attr_namefull) + attr_namefull.size();
	std::size_t endpos = source.find("\"", startpos);
	return source.substr(startpos, endpos - startpos);
}